

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

Address * cfd::core::ConfidentialTransaction::GetPegoutAddressFromDescriptor
                    (Address *__return_storage_ptr__,string *bitcoin_descriptor,
                    uint32_t bip32_counter,NetType net_type,NetType elements_net_type)

{
  allocator local_129;
  ByteData prefix;
  ExtPubkey base_ext_pubkey;
  ExtPubkey local_a0;
  
  if (net_type == kMainnet) {
    ::std::__cxx11::string::string((string *)&base_ext_pubkey,"0488b21e",&local_129);
    ByteData::ByteData(&prefix,(string *)&base_ext_pubkey);
  }
  else {
    ::std::__cxx11::string::string((string *)&base_ext_pubkey,"043587cf",&local_129);
    ByteData::ByteData(&prefix,(string *)&base_ext_pubkey);
  }
  ::std::__cxx11::string::~string((string *)&base_ext_pubkey);
  ExtPubkey::ExtPubkey(&base_ext_pubkey);
  core::Address::Address(__return_storage_ptr__);
  GenerateExtPubkeyFromDescriptor
            (&local_a0,bitcoin_descriptor,bip32_counter,&prefix,net_type,elements_net_type,
             &base_ext_pubkey,__return_storage_ptr__);
  ExtPubkey::~ExtPubkey(&local_a0);
  ExtPubkey::~ExtPubkey(&base_ext_pubkey);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&prefix);
  return __return_storage_ptr__;
}

Assistant:

Address ConfidentialTransaction::GetPegoutAddressFromDescriptor(
    const std::string &bitcoin_descriptor, uint32_t bip32_counter,
    NetType net_type, NetType elements_net_type) {
  auto prefix = (net_type == NetType::kMainnet) ? ByteData("0488b21e")
                                                : ByteData("043587cf");
  ExtPubkey base_ext_pubkey;
  Address result;
  GenerateExtPubkeyFromDescriptor(
      bitcoin_descriptor, bip32_counter, prefix, net_type, elements_net_type,
      &base_ext_pubkey, &result);
  return result;
}